

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstCompiler.cpp
# Opt level: O3

void __thiscall
compiler::CompilerAstWalker::onEnterFunctionDeclarationExpressionAstNode
          (CompilerAstWalker *this,FunctionDeclarationExpressionAstNode *node)

{
  pointer psVar1;
  pointer pCVar2;
  pointer pCVar3;
  element_type *peVar4;
  undefined8 uVar5;
  pointer psVar6;
  pointer *__p;
  shared_ptr<compiler::EmissionContext> ec;
  new_allocator<compiler::EmissionContext> local_31;
  
  peVar4 = (element_type *)operator_new(0x120);
  (peVar4->variables).
  super__Vector_base<compiler::VariableDeclaration,_std::allocator<compiler::VariableDeclaration>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x100000001;
  (peVar4->variables).
  super__Vector_base<compiler::VariableDeclaration,_std::allocator<compiler::VariableDeclaration>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)&PTR___Sp_counted_ptr_inplace_00130bd0;
  __p = &(peVar4->variables).
         super__Vector_base<compiler::VariableDeclaration,_std::allocator<compiler::VariableDeclaration>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
  ec.super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  __gnu_cxx::new_allocator<compiler::EmissionContext>::
  construct<compiler::EmissionContext,std::shared_ptr<compiler::EmissionContext>&>
            (&local_31,(EmissionContext *)__p,&this->ec);
  psVar6 = (node->parameters).
           super__Vector_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  psVar1 = (node->parameters).
           super__Vector_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  ec.super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar4;
  while( true ) {
    if (psVar6 == psVar1) {
      *(pointer **)
       &ec.super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi[0x12]._M_use_count = __p;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 (ec.super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi + 0x13),(__shared_count<(__gnu_cxx::_Lock_policy)2> *)&ec);
      if (ec.super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   ec.super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
      }
      return;
    }
    EmissionContext::Declare
              ((EmissionContext *)__p,
               &((psVar6->super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->value);
    pCVar2 = (pointer)(peVar4->variables).
                      super__Vector_base<compiler::VariableDeclaration,_std::allocator<compiler::VariableDeclaration>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pCVar3 = (peVar4->closures).
             super__Vector_base<compiler::ClosureContext,_std::allocator<compiler::ClosureContext>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (pCVar3 == pCVar2) break;
    ((pointer)
    ((long)pCVar2 + (((long)pCVar3 - (long)pCVar2 >> 3) * -0x3333333333333333 + -1) * 0x28))->
    isFullyBound = true;
    psVar6 = psVar6 + 1;
  }
  uVar5 = std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
  __clang_call_terminate(uVar5);
}

Assistant:

void onEnterFunctionDeclarationExpressionAstNode(FunctionDeclarationExpressionAstNode* node) noexcept override {
    auto ec = std::make_shared<compiler::EmissionContext>(this->ec);

    for (const auto& var : node->parameters) {
      ec->Declare(var->value);
      // immediately fully bind all parameters as are never half-declared
      ec->FullyBind(ec->variables.size() - 1);
    }

    this->ec = ec;
  }